

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strglob(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  uchar *zPattern_00;
  uchar *zString_00;
  int rc;
  int iEsc;
  char *zPattern;
  char *zString;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (((1 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) &&
     (iVar1 = jx9_value_is_string(apArg[1]), iVar1 != 0)) {
    zPattern_00 = (uchar *)jx9_value_to_string(*apArg,(int *)0x0);
    zString_00 = (uchar *)jx9_value_to_string(apArg[1],(int *)0x0);
    iVar1 = Glob(zPattern_00,zString_00,0x5c,0);
    jx9_result_bool(pCtx,iVar1);
    return 0;
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strglob(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zPattern;
	int iEsc = '\\';
	int rc;
	if( nArg < 2 || !jx9_value_is_string(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the pattern and the string */
	zPattern  = jx9_value_to_string(apArg[0], 0);
	zString = jx9_value_to_string(apArg[1], 0);
	/* Go globbing */
	rc = Glob((const unsigned char *)zPattern, (const unsigned char *)zString, iEsc, 0);
	/* Globbing result */
	jx9_result_bool(pCtx, rc);
	return JX9_OK;
}